

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O0

parasail_profile_t *
parasail_profile_create_sse_128_8(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  undefined1 local_a4;
  undefined1 local_a0;
  int local_9c;
  longlong lStack_98;
  __m128i_8_t t;
  undefined8 local_80;
  parasail_profile_t *profile;
  __m128i *palStack_70;
  int32_t index;
  __m128i *vProfile;
  int32_t segLen;
  int32_t segWidth;
  int32_t n;
  int32_t segNum;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1Len;
  parasail_matrix_t *matrix_local;
  char *pcStack_38;
  int _s1Len_local;
  char *s1_local;
  
  j = 0;
  k = 0;
  segNum = 0;
  n = 0;
  segWidth = 0;
  segLen = 0;
  vProfile._4_4_ = 0x10;
  vProfile._0_4_ = 0;
  palStack_70 = (__m128i *)0x0;
  profile._4_4_ = 0;
  local_80 = 0;
  _i = matrix;
  matrix_local._4_4_ = _s1Len;
  pcStack_38 = s1;
  if (matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_sse_128_8","matrix");
    s1_local = (char *)0x0;
  }
  else if ((matrix->type == 0) && (s1 == (char *)0x0)) {
    fprintf(_stderr,"%s: missing %s\n","parasail_profile_create_sse_128_8","s1");
    s1_local = (char *)0x0;
  }
  else {
    local_9c = _s1Len;
    if (matrix->type != 0) {
      local_9c = matrix->length;
    }
    j = local_9c;
    segLen = matrix->size;
    vProfile._0_4_ = (local_9c + 0xf) / 0x10;
    palStack_70 = parasail_memalign___m128i(0x10,(long)(segLen * (int)vProfile));
    if (palStack_70 == (__m128i *)0x0) {
      s1_local = (char *)0x0;
    }
    else {
      s1_local = (char *)parasail_profile_new(pcStack_38,j,_i);
      if ((parasail_profile_t *)s1_local == (parasail_profile_t *)0x0) {
        s1_local = (char *)0x0;
      }
      else {
        for (n = 0; n < segLen; n = n + 1) {
          for (k = 0; k < (int)vProfile; k = k + 1) {
            segNum = k;
            for (segWidth = 0; segWidth < 0x10; segWidth = segWidth + 1) {
              if (_i->type == 0) {
                if (segNum < j) {
                  local_a0 = (undefined1)
                             _i->matrix[segLen * n + _i->mapper[(byte)pcStack_38[segNum]]];
                }
                else {
                  local_a0 = 0;
                }
                *(undefined1 *)((long)&lStack_98 + (long)segWidth) = local_a0;
              }
              else {
                if (segNum < j) {
                  local_a4 = (undefined1)
                             _i->matrix[segLen * segNum + _i->mapper[(byte)_i->alphabet[n]]];
                }
                else {
                  local_a4 = 0;
                }
                *(undefined1 *)((long)&lStack_98 + (long)segWidth) = local_a4;
              }
              segNum = (int)vProfile + segNum;
            }
            palStack_70[profile._4_4_][0] = lStack_98;
            palStack_70[profile._4_4_][1] = t.m[0];
            profile._4_4_ = profile._4_4_ + 1;
          }
        }
        (((parasail_profile_t *)s1_local)->profile8).score = palStack_70;
        ((parasail_profile_t *)s1_local)->free = parasail_free___m128i;
      }
    }
  }
  return (parasail_profile_t *)s1_local;
}

Assistant:

parasail_profile_t * parasail_profile_create_sse_128_8(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0; /* number of amino acids in table */
    const int32_t segWidth = 16; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is ignored for pssm, required for square */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size;
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_8_t t;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], t.m);
            ++index;
        }
    }

    profile->profile8.score = vProfile;
    profile->free = &parasail_free___m128i;
    return profile;
}